

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O2

int Extra_ThreshAssignWeights
              (word *t,char *pIsop,char *pIsopFneg,int nVars,int *pW,int *pChow,int nChows,int Wmin)

{
  bool bVar1;
  int iVar2;
  int *pWofChow;
  size_t sVar3;
  size_t sVar4;
  unsigned_long **pGreaters;
  unsigned_long *puVar5;
  unsigned_long **pSmallers;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int Cost_3;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int Cost;
  int iVar14;
  int iVar15;
  long lVar16;
  int Cost_2;
  long lVar17;
  ulong uVar18;
  int in_stack_ffffffffffffff58;
  
  lVar17 = (long)nChows;
  pWofChow = (int *)malloc(lVar17 * 4);
  sVar3 = strlen(pIsop);
  uVar7 = (ulong)(nVars + 3);
  sVar4 = strlen(pIsopFneg);
  iVar2 = (int)(sVar4 / uVar7) * (int)(sVar3 / uVar7);
  lVar8 = (long)iVar2;
  pGreaters = (unsigned_long **)malloc(lVar8 * 8);
  for (lVar16 = 0; lVar16 < lVar8; lVar16 = lVar16 + 1) {
    puVar5 = (unsigned_long *)malloc(lVar17 * 8);
    pGreaters[lVar16] = puVar5;
  }
  pSmallers = (unsigned_long **)malloc(lVar8 * 8);
  for (lVar16 = 0; lVar16 < lVar8; lVar16 = lVar16 + 1) {
    puVar5 = (unsigned_long *)malloc(lVar17 * 8);
    pSmallers[lVar16] = puVar5;
  }
  Extra_ThreshCreateInequalities
            (pIsop,pIsopFneg,nVars,(int *)pSmallers,pChow,nChows,in_stack_ffffffffffffff58,pGreaters
             ,pSmallers);
  Extra_ThreshSimplifyInequalities(iVar2,nChows,pGreaters,pSmallers);
  *pWofChow = Wmin;
  for (lVar16 = 1; lVar16 < lVar17; lVar16 = lVar16 + 1) {
    pWofChow[lVar16] = pWofChow[lVar16 + -1] + 1;
  }
  uVar18 = 0;
  uVar6 = 0;
  if (0 < nChows) {
    uVar6 = (ulong)(uint)nChows;
  }
  iVar11 = -1000;
  bVar1 = false;
LAB_0068125b:
  if ((uVar18 == uVar6) || (nVars * 2 < pWofChow[lVar17 + -1])) {
    for (lVar16 = 0; lVar16 < lVar8; lVar16 = lVar16 + 1) {
      free(pGreaters[lVar16]);
    }
    free(pGreaters);
    for (lVar16 = 0; lVar16 < lVar8; lVar16 = lVar16 + 1) {
      free(pSmallers[lVar16]);
    }
    free(pSmallers);
    sVar3 = strlen(pIsop);
    iVar2 = 1000;
    for (lVar8 = 0; lVar8 < (int)sVar3; lVar8 = lVar8 + uVar7) {
      iVar11 = 0;
      for (lVar16 = 0; lVar8 + lVar16 < lVar8 + nVars; lVar16 = lVar16 + 1) {
        if (pIsop[lVar16] == '1') {
          iVar11 = iVar11 + pWofChow[pChow[lVar16]];
        }
      }
      if (iVar11 <= iVar2) {
        iVar2 = iVar11;
      }
      pIsop = pIsop + uVar7;
    }
    sVar3 = strlen(pIsopFneg);
    iVar11 = 0;
    for (lVar8 = 0; lVar8 < (int)sVar3; lVar8 = lVar8 + uVar7) {
      iVar12 = 0;
      for (lVar16 = 0; lVar8 + lVar16 < lVar8 + nVars; lVar16 = lVar16 + 1) {
        if (pIsopFneg[lVar16] == '-') {
          iVar12 = iVar12 + pWofChow[pChow[lVar16]];
        }
      }
      if (iVar11 <= iVar12) {
        iVar11 = iVar12;
      }
      pIsopFneg = pIsopFneg + uVar7;
    }
    uVar6 = 0;
    uVar7 = (ulong)(uint)nVars;
    if (nVars < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      pW[uVar6] = pWofChow[pChow[uVar6]];
    }
    free(pWofChow);
    iVar12 = 0;
    if (iVar11 < iVar2) {
      iVar12 = iVar2;
    }
    return iVar12;
  }
  uVar9 = 0;
LAB_00681277:
  do {
    while( true ) {
      uVar9 = (ulong)(int)uVar9;
      while( true ) {
        iVar12 = (int)uVar9;
        if (iVar2 <= iVar12) {
          uVar18 = uVar18 + 1;
          goto LAB_0068125b;
        }
        if (pGreaters[uVar9][uVar18] != 0) break;
        uVar9 = uVar9 + 1;
      }
      iVar14 = 0;
      for (uVar13 = 0; (uint)nChows != uVar13; uVar13 = uVar13 + 1) {
        iVar14 = iVar14 + pWofChow[uVar13] * (int)pGreaters[uVar9][uVar13];
      }
      iVar10 = 0;
      for (uVar13 = 0; (uint)nChows != uVar13; uVar13 = uVar13 + 1) {
        iVar10 = iVar10 + pWofChow[uVar13] * (int)pSmallers[uVar9][uVar13];
      }
      iVar15 = iVar14 - iVar10;
      if (iVar15 == 0 || iVar14 < iVar10) break;
      if (bVar1) {
        iVar11 = -1000;
      }
      uVar9 = (ulong)(iVar12 + 1);
      if (bVar1) {
        uVar9 = 0;
      }
LAB_006812dc:
      bVar1 = false;
    }
    if (iVar11 < iVar15) {
      Extra_ThreshIncrementWeights(nChows,pWofChow,(int)uVar18);
      bVar1 = true;
      iVar11 = iVar15;
      goto LAB_00681277;
    }
    if (!bVar1) {
      uVar9 = (ulong)(iVar12 + 1);
      goto LAB_006812dc;
    }
    Extra_ThreshDecrementWeights(nChows,pWofChow,(int)uVar18);
    uVar9 = (ulong)(iVar12 + 1);
    bVar1 = false;
    iVar11 = -1000;
  } while( true );
}

Assistant:

int Extra_ThreshAssignWeights(word * t, char * pIsop, char * pIsopFneg,
        int nVars, int * pW, int * pChow, int nChows, int Wmin) {

    int i = 0, j = 0, Lmin = 1000, Lmax = 0, Limit = nVars * 2, delta = 0,
            deltaOld = -1000, fIncremented = 0;
    //******************************
    int * pWofChow = ABC_ALLOC( int, nChows );
    int nCubesIsop = strlen(pIsop) / (nVars + 3);
    int nCubesIsopFneg = strlen(pIsopFneg) / (nVars + 3);
    int nInequalities = nCubesIsop * nCubesIsopFneg;
    unsigned long **pGreaters;
    unsigned long **pSmallers;

    pGreaters = (unsigned long **)malloc(nCubesIsop * nCubesIsopFneg * sizeof *pGreaters);
    for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
        pGreaters[i] = (unsigned long *)malloc(nChows * sizeof *pGreaters[i]);
    }
    pSmallers = (unsigned long **)malloc(nCubesIsop * nCubesIsopFneg * sizeof *pSmallers);
    for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
        pSmallers[i] = (unsigned long *)malloc(nChows * sizeof *pSmallers[i]);
    }

    //******************************
    Extra_ThreshCreateInequalities(pIsop, pIsopFneg, nVars, pWofChow, pChow,
            nChows, nInequalities, pGreaters, pSmallers);
    Extra_ThreshSimplifyInequalities(nInequalities, nChows, pGreaters,
            pSmallers);

    //initializes the weights
    pWofChow[0] = Wmin;
    for (i = 1; i < nChows; i++) {
        pWofChow[i] = pWofChow[i - 1] + 1;
    }
    i = 0;

    //assign the weights respecting the inequalities
    while (i < nChows && pWofChow[nChows - 1] <= Limit) {
        Lmin = 1000;
        Lmax = 0;

        while (j < nInequalities) {
            if (pGreaters[j][i] != 0) {
                Lmin = Extra_ThreshCubeWeightedSum3(pWofChow, nChows, pGreaters,
                        j);
                Lmax = Extra_ThreshCubeWeightedSum4(pWofChow, nChows, pSmallers,
                        j);
                delta = Lmin - Lmax;

                if (delta > 0) {
                    if (fIncremented == 1) {
                        j = 0;
                        fIncremented = 0;
                        deltaOld = -1000;
                    } else
                        j++;
                    continue;
                }
                if (delta > deltaOld) {
                    Extra_ThreshIncrementWeights(nChows, pWofChow, i);
                    deltaOld = delta;
                    fIncremented = 1;
                } else if (fIncremented == 1) {
                    Extra_ThreshDecrementWeights(nChows, pWofChow, i);
                    j++;
                    deltaOld = -1000;
                    fIncremented = 0;
                    continue;
                } else
                    j++;
            } else
                j++;

        }
        i++;
        j = 0;
    }

    //******************************
    for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
        free(pGreaters[i]);
    }
    free(pGreaters);
    for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
        free(pSmallers[i]);
    }
    free(pSmallers);
    //******************************

    i = 0;
    Lmin = 1000;
    Lmax = 0;

    //check the assigned weights in the original system
    for (j = 0; j < (int)strlen(pIsop); j += (nVars + 3))
        Lmin = Abc_MinInt(Lmin,
                Extra_ThreshCubeWeightedSum1(pWofChow, pChow, pIsop, nVars, j));
    for (j = 0; j < (int)strlen(pIsopFneg); j += (nVars + 3))
        Lmax = Abc_MaxInt(Lmax,
                Extra_ThreshCubeWeightedSum2(pWofChow, pChow, pIsopFneg, nVars,
                        j));

    for (i = 0; i < nVars; i++) {
        pW[i] = pWofChow[pChow[i]];
    }

    ABC_FREE( pWofChow );
    if (Lmin > Lmax)
        return Lmin;
    else
        return 0;
}